

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinNode.cpp
# Opt level: O0

void __thiscall JoinNode::JoinNode(JoinNode *this,Instruction *value,CallInst *callInst)

{
  undefined8 in_RDX;
  Node *in_RSI;
  Instruction *in_RDI;
  CallInst *in_stack_ffffffffffffffd8;
  
  Node::Node(in_RSI,(NodeType)((ulong)in_RDX >> 0x20),in_RDI,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__JoinNode_001cdb00;
  std::set<const_ExitNode_*,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_>::set
            ((set<const_ExitNode_*,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_>
              *)0x18cf20);
  std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::set
            ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)0x18cf31);
  return;
}

Assistant:

JoinNode::JoinNode(const llvm::Instruction *value,
                   const llvm::CallInst *callInst)
        : Node(NodeType::JOIN, value, callInst) {}